

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

int __thiscall capnp::_::OrphanBuilder::truncate(OrphanBuilder *this,char *__file,__off_t __length)

{
  int iVar1;
  int extraout_EAX;
  OrphanBuilder OStack_38;
  
  iVar1 = truncate(this,__file,0);
  if ((char)iVar1 == '\0') {
    initList(&OStack_38,(BuilderArena *)(this->segment->super_SegmentReader).arena,this->capTable,
             (ElementCount)__file,(ElementSize)__length);
    operator=(this,&OStack_38);
    ~OrphanBuilder(&OStack_38);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void OrphanBuilder::truncate(ElementCount size, ElementSize elementSize) {
  if (!truncate(size, false)) {
    // assumeBits() safe since it's checked inside truncate()
    *this = initList(segment->getArena(), capTable,
        assumeBits<LIST_ELEMENT_COUNT_BITS>(size), elementSize);
  }
}